

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall deqp::gles3::Functional::FloatStateQueryTests::deinit(FloatStateQueryTests *this)

{
  FloatStateQueryTests *this_local;
  
  if (this->m_verifierBoolean != (GetBooleanVerifier *)0x0) {
    if (this->m_verifierBoolean != (GetBooleanVerifier *)0x0) {
      (*(this->m_verifierBoolean->super_StateVerifier)._vptr_StateVerifier[1])();
    }
    this->m_verifierBoolean = (GetBooleanVerifier *)0x0;
  }
  if (this->m_verifierInteger != (GetIntegerVerifier *)0x0) {
    if (this->m_verifierInteger != (GetIntegerVerifier *)0x0) {
      (*(this->m_verifierInteger->super_StateVerifier)._vptr_StateVerifier[1])();
    }
    this->m_verifierInteger = (GetIntegerVerifier *)0x0;
  }
  if (this->m_verifierInteger64 != (GetInteger64Verifier *)0x0) {
    if (this->m_verifierInteger64 != (GetInteger64Verifier *)0x0) {
      (*(this->m_verifierInteger64->super_StateVerifier)._vptr_StateVerifier[1])();
    }
    this->m_verifierInteger64 = (GetInteger64Verifier *)0x0;
  }
  if (this->m_verifierFloat != (GetFloatVerifier *)0x0) {
    if (this->m_verifierFloat != (GetFloatVerifier *)0x0) {
      (*(this->m_verifierFloat->super_StateVerifier)._vptr_StateVerifier[1])();
    }
    this->m_verifierFloat = (GetFloatVerifier *)0x0;
  }
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

void FloatStateQueryTests::deinit (void)
{
	if (m_verifierBoolean)
	{
		delete m_verifierBoolean;
		m_verifierBoolean = DE_NULL;
	}
	if (m_verifierInteger)
	{
		delete m_verifierInteger;
		m_verifierInteger = DE_NULL;
	}
	if (m_verifierInteger64)
	{
		delete m_verifierInteger64;
		m_verifierInteger64 = DE_NULL;
	}
	if (m_verifierFloat)
	{
		delete m_verifierFloat;
		m_verifierFloat = DE_NULL;
	}

	this->TestCaseGroup::deinit();
}